

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestCase::~TestCase(TestCase *this)

{
  TestResult *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  (in_RDI->test_properites_mutex_).super_MutexBase.mutex_.__align = (long)&PTR__TestCase_001ac1f8;
  internal::
  ForEach<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,void(*)(testing::TestInfo*)>
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)unaff_retaddr,
             (_func_void_TestInfo_ptr *)in_RDI);
  TestResult::~TestResult(in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::~vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)unaff_retaddr);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x157c4a);
  std::__cxx11::string::~string
            ((string *)((in_RDI->test_properites_mutex_).super_MutexBase.mutex_.__size + 8));
  return;
}

Assistant:

TestCase::~TestCase() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}